

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_inflatev(ucvector *out,uchar *in,size_t insize,LodePNGDecompressSettings *settings)

{
  byte bVar1;
  byte bVar2;
  uint btype;
  uint local_4c;
  uint BTYPE;
  uint error;
  size_t pos;
  size_t sStack_38;
  uint BFINAL;
  size_t bp;
  LodePNGDecompressSettings *settings_local;
  size_t insize_local;
  uchar *in_local;
  ucvector *out_local;
  
  sStack_38 = 0;
  pos._4_4_ = 0;
  _BTYPE = 0;
  local_4c = 0;
  bp = (size_t)settings;
  settings_local = (LodePNGDecompressSettings *)insize;
  insize_local = (size_t)in;
  in_local = (uchar *)out;
  do {
    if (pos._4_4_ != 0) {
      return local_4c;
    }
    if ((ulong)((long)settings_local << 3) <= sStack_38 + 2) {
      return 0x34;
    }
    bVar1 = readBitFromStream(&stack0xffffffffffffffc8,(uchar *)insize_local);
    pos._4_4_ = (uint)bVar1;
    bVar1 = readBitFromStream(&stack0xffffffffffffffc8,(uchar *)insize_local);
    bVar2 = readBitFromStream(&stack0xffffffffffffffc8,(uchar *)insize_local);
    btype = (uint)bVar2 * 2 + (uint)bVar1;
    if (btype == 3) {
      return 0x14;
    }
    if (btype == 0) {
      local_4c = inflateNoCompression
                           ((ucvector *)in_local,(uchar *)insize_local,&stack0xffffffffffffffc8,
                            (size_t *)&BTYPE,(size_t)settings_local);
    }
    else {
      local_4c = inflateHuffmanBlock((ucvector *)in_local,(uchar *)insize_local,
                                     &stack0xffffffffffffffc8,(size_t *)&BTYPE,
                                     (size_t)settings_local,btype);
    }
  } while (local_4c == 0);
  return local_4c;
}

Assistant:

static unsigned lodepng_inflatev(ucvector* out,
                                 const unsigned char* in, size_t insize,
                                 const LodePNGDecompressSettings* settings)
{
  /*bit pointer in the "in" data, current byte is bp >> 3, current bit is bp & 0x7 (from lsb to msb of the byte)*/
  size_t bp = 0;
  unsigned BFINAL = 0;
  size_t pos = 0; /*byte position in the out buffer*/
  unsigned error = 0;

  (void)settings;

  while(!BFINAL)
  {
    unsigned BTYPE;
    if(bp + 2 >= insize * 8) return 52; /*error, bit pointer will jump past memory*/
    BFINAL = readBitFromStream(&bp, in);
    BTYPE = 1u * readBitFromStream(&bp, in);
    BTYPE += 2u * readBitFromStream(&bp, in);

    if(BTYPE == 3) return 20; /*error: invalid BTYPE*/
    else if(BTYPE == 0) error = inflateNoCompression(out, in, &bp, &pos, insize); /*no compression*/
    else error = inflateHuffmanBlock(out, in, &bp, &pos, insize, BTYPE); /*compression, BTYPE 01 or 10*/

    if(error) return error;
  }

  return error;
}